

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O2

bool pstore::command_line::details::handler_set_value
               (maybe<pstore::command_line::option_*,_void> *handler,string *value)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  option **ppoVar4;
  maybe<pstore::command_line::option_*,_void> local_28;
  
  maybe<pstore::command_line::option_*,_void>::maybe(&local_28,handler);
  bVar1 = handler_takes_argument(&local_28);
  if (bVar1) {
    if (local_28.valid_ == true) {
      local_28.valid_ = false;
    }
    ppoVar4 = maybe<pstore::command_line::option_*,_void>::operator->(handler);
    iVar3 = (*(*ppoVar4)->_vptr_option[0x10])();
    if ((char)iVar3 == '\0') {
      uVar2 = 0;
    }
    else {
      ppoVar4 = maybe<pstore::command_line::option_*,_void>::operator->(handler);
      iVar3 = (*(*ppoVar4)->_vptr_option[0xf])(*ppoVar4,value);
      uVar2 = (undefined1)iVar3;
    }
    return (bool)uVar2;
  }
  assert_failed("handler_takes_argument (handler)",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/command_line.cpp"
                ,0x55);
}

Assistant:

bool handler_set_value (maybe<option *> handler, std::string const & value) {
                    PSTORE_ASSERT (handler_takes_argument (handler));
                    if (!(*handler)->add_occurrence ()) {
                        return false;
                    }
                    return (*handler)->value (value);
                }